

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O0

void __thiscall
mocker::detail::ReassociationImpl::rebuild
          (ReassociationImpl *this,
          priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
          *q,iterator pos)

{
  FunctionModule *pFVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  reference psVar4;
  size_type sVar5;
  const_reference pvVar6;
  byte local_2c9;
  int local_258;
  bool local_251;
  _List_node_base *local_250;
  shared_ptr<mocker::ir::IRInst> local_248;
  const_iterator local_238;
  undefined1 local_22c [12];
  shared_ptr<mocker::ir::ArithBinaryInst> newInst;
  shared_ptr<mocker::ir::IRInst> local_210;
  const_iterator local_200;
  undefined1 local_1f4 [4];
  shared_ptr<mocker::ir::Reg> local_1f0;
  undefined1 local_1e0 [8];
  shared_ptr<mocker::ir::ArithUnaryInst> newInst_1;
  string local_1c8 [32];
  undefined1 local_1a8 [24];
  shared_ptr<mocker::ir::Addr> lhsVal;
  string local_180 [32];
  undefined1 local_160 [24];
  shared_ptr<mocker::ir::IntLiteral> local_148;
  shared_ptr<mocker::ir::IntLiteral> local_138;
  undefined1 local_128 [8];
  value_type rhs;
  value_type lhs;
  undefined1 local_c4 [20];
  shared_ptr<mocker::ir::IRInst> local_b0;
  const_iterator local_a0;
  _List_node_base *local_98;
  shared_ptr<mocker::ir::Assign> local_90;
  shared_ptr<mocker::ir::IRInst> local_80;
  const_iterator local_70;
  undefined1 local_68 [8];
  value_type val;
  undefined1 local_38 [8];
  shared_ptr<mocker::ir::Reg> dest;
  InstList *insts;
  priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
  *q_local;
  ReassociationImpl *this_local;
  iterator pos_local;
  
  this_local = (ReassociationImpl *)pos._M_node;
  dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ir::BasicBlock::getMutableInsts_abi_cxx11_(this->bb);
  psVar4 = std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                     ((_List_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&this_local);
  ir::getDest((ir *)local_38,psVar4);
  sVar5 = std::
          priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
          ::size(q);
  if (sVar5 == 1) {
    pvVar6 = std::
             priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
             ::top(q);
    RankedNode::RankedNode((RankedNode *)local_68,pvVar6);
    _Var2 = dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if ((local_68[0] & 1U) == 0) {
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::_List_const_iterator
                (&local_a0,(iterator *)&this_local);
      local_c4._0_4_ = 0;
      std::
      make_shared<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                ((shared_ptr<mocker::ir::Reg> *)(local_c4 + 4),(OpType *)local_38,
                 (shared_ptr<mocker::ir::Addr> *)local_c4);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::ArithUnaryInst,void>
                (&local_b0,(shared_ptr<mocker::ir::ArithUnaryInst> *)(local_c4 + 4));
      std::__cxx11::
      list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
      ::insert((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                *)_Var2._M_pi,local_a0,&local_b0);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_b0);
      std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr
                ((shared_ptr<mocker::ir::ArithUnaryInst> *)(local_c4 + 4));
    }
    else {
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::_List_const_iterator
                (&local_70,(iterator *)&this_local);
      std::
      make_shared<mocker::ir::Assign,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                ((shared_ptr<mocker::ir::Reg> *)&local_90,(shared_ptr<mocker::ir::Addr> *)local_38);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Assign,void>(&local_80,&local_90);
      local_98 = (_List_node_base *)
                 std::__cxx11::
                 list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                 ::insert((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                           *)_Var2._M_pi,local_70,&local_80);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_80);
      std::shared_ptr<mocker::ir::Assign>::~shared_ptr(&local_90);
    }
    RankedNode::~RankedNode((RankedNode *)local_68);
  }
  else {
    do {
      bVar3 = std::
              priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
              ::empty(q);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      psVar4 = std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                         ((_List_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&this_local);
      ir::getDest((ir *)&lhs.rank,psVar4);
      std::shared_ptr<mocker::ir::Reg>::operator=
                ((shared_ptr<mocker::ir::Reg> *)local_38,(shared_ptr<mocker::ir::Reg> *)&lhs.rank);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)&lhs.rank);
      pvVar6 = std::
               priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
               ::top(q);
      RankedNode::RankedNode((RankedNode *)&rhs.rank,pvVar6);
      std::
      priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
      ::pop(q);
      bVar3 = std::
              priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
              ::empty(q);
      if (bVar3) {
        bVar3 = true;
      }
      else {
        pvVar6 = std::
                 priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
                 ::top(q);
        RankedNode::RankedNode((RankedNode *)local_128,pvVar6);
        std::
        priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
        ::pop(q);
        local_160[0x17] = 0;
        ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                  ((ir *)&local_138,(shared_ptr<mocker::ir::Addr> *)&lhs);
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_138);
        local_2c9 = 1;
        if (bVar3) {
          ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                    ((ir *)&local_148,(shared_ptr<mocker::ir::Addr> *)&rhs);
          local_160[0x17] = 1;
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_148);
          local_2c9 = bVar3 ^ 0xff;
        }
        if ((local_2c9 & 1) == 0) {
          __assert_fail("!ir::dyc<ir::IntLiteral>(lhs.value) || !ir::dyc<ir::IntLiteral>(rhs.value)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                        ,0x132,
                        "void mocker::detail::ReassociationImpl::rebuild(std::priority_queue<detail::ReassociationImpl::RankedNode> &, std::list<std::shared_ptr<ir::IRInst>>::iterator)"
                       );
        }
        if ((local_160[0x17] & 1) != 0) {
          std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_148);
        }
        std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_138);
        bVar3 = std::
                priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
                ::empty(q);
        if (!bVar3) {
          pFVar1 = this->func;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_180,"",
                     (allocator<char> *)
                     ((long)&lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_160,&pFVar1->identifier);
          std::shared_ptr<mocker::ir::Reg>::operator=
                    ((shared_ptr<mocker::ir::Reg> *)local_38,
                     (shared_ptr<mocker::ir::Reg> *)local_160);
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_160);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&lhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
        }
        if (((byte)rhs.rank & 1) == 0) {
          std::swap<mocker::detail::ReassociationImpl::RankedNode>
                    ((RankedNode *)&rhs.rank,(RankedNode *)local_128);
        }
        std::shared_ptr<mocker::ir::Addr>::shared_ptr
                  ((shared_ptr<mocker::ir::Addr> *)(local_1a8 + 0x10),
                   (shared_ptr<mocker::ir::Addr> *)&lhs);
        if (((byte)rhs.rank & 1) == 0) {
          pFVar1 = this->func;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1c8,"",
                     (allocator<char> *)
                     ((long)&newInst_1.
                             super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_1a8,&pFVar1->identifier);
          std::shared_ptr<mocker::ir::Addr>::operator=
                    ((shared_ptr<mocker::ir::Addr> *)(local_1a8 + 0x10),
                     (shared_ptr<mocker::ir::Reg> *)local_1a8);
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_1a8);
          std::__cxx11::string::~string(local_1c8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&newInst_1.
                             super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          ir::dycLocalReg((ir *)&local_1f0,(shared_ptr<mocker::ir::Addr> *)(local_1a8 + 0x10));
          local_1f4 = (undefined1  [4])0x0;
          std::
          make_shared<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::Reg>,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                    ((shared_ptr<mocker::ir::Reg> *)local_1e0,(OpType *)&local_1f0,
                     (shared_ptr<mocker::ir::Addr> *)local_1f4);
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_1f0);
          _Var2 = dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::_List_const_iterator
                    (&local_200,(iterator *)&this_local);
          std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::ArithUnaryInst,void>
                    (&local_210,(shared_ptr<mocker::ir::ArithUnaryInst> *)local_1e0);
          newInst.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::insert(_Var2._M_pi,local_200,&local_210);
          std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_210);
          std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr
                    ((shared_ptr<mocker::ir::ArithUnaryInst> *)local_1e0);
        }
        local_22c._0_4_ = 6 - (local_128[0] & 1);
        std::
        make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                  ((shared_ptr<mocker::ir::Reg> *)(local_22c + 4),(OpType *)local_38,
                   (shared_ptr<mocker::ir::Addr> *)local_22c,
                   (shared_ptr<mocker::ir::Addr> *)(local_1a8 + 0x10));
        _Var2 = dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::_List_const_iterator
                  (&local_238,(iterator *)&this_local);
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::ArithBinaryInst,void>
                  (&local_248,(shared_ptr<mocker::ir::ArithBinaryInst> *)(local_22c + 4));
        local_250 = (_List_node_base *)
                    std::__cxx11::
                    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ::insert((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                              *)_Var2._M_pi,local_238,&local_248);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_248);
        bVar3 = std::
                priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
                ::empty(q);
        if (!bVar3) {
          local_251 = true;
          local_258 = (int)lhs.value.
                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi +
                      (int)rhs.value.
                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          std::
          priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
          ::emplace<bool,std::shared_ptr<mocker::ir::Reg>&,int>
                    ((priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
                      *)q,&local_251,(shared_ptr<mocker::ir::Reg> *)local_38,&local_258);
        }
        std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                  ((shared_ptr<mocker::ir::ArithBinaryInst> *)(local_22c + 4));
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                  ((shared_ptr<mocker::ir::Addr> *)(local_1a8 + 0x10));
        RankedNode::~RankedNode((RankedNode *)local_128);
        bVar3 = false;
      }
      RankedNode::~RankedNode((RankedNode *)&rhs.rank);
    } while (!bVar3);
  }
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_38);
  return;
}

Assistant:

void detail::ReassociationImpl::rebuild(
    std::priority_queue<detail::ReassociationImpl::RankedNode> &q,
    std::list<std::shared_ptr<ir::IRInst>>::iterator pos) {
  auto &insts = bb.getMutableInsts();
  auto dest = ir::getDest(*pos);

  //  std::cerr << "rebuilding: " <<  ir::fmtAddr(dest) << std::endl;

  if (q.size() == 1) {
    auto val = q.top();
    if (val.positive)
      insts.insert(pos, std::make_shared<ir::Assign>(dest, val.value));
    else
      insts.insert(pos, std::make_shared<ir::ArithUnaryInst>(
                            dest, ir::ArithUnaryInst::Neg, val.value));
    return;
  }

  while (!q.empty()) {
    dest = ir::getDest(*pos);
    auto lhs = q.top();
    q.pop();
    if (q.empty())
      return;
    auto rhs = q.top();
    q.pop();

    assert(!ir::dyc<ir::IntLiteral>(lhs.value) ||
           !ir::dyc<ir::IntLiteral>(rhs.value));

    if (!q.empty())
      dest = func.makeTempLocalReg();

    // emit
    if (!lhs.positive)
      std::swap(lhs, rhs);
    auto lhsVal = lhs.value;
    if (!lhs.positive) {
      lhsVal = func.makeTempLocalReg();
      auto newInst = std::make_shared<ir::ArithUnaryInst>(
          ir::dycLocalReg(lhsVal), ir::ArithUnaryInst::Neg, lhs.value);
      insts.insert(pos, newInst);
    }
    auto newInst = std::make_shared<ir::ArithBinaryInst>(
        dest,
        rhs.positive ? ir::ArithBinaryInst::Add : ir::ArithBinaryInst::Sub,
        lhsVal, rhs.value);
    insts.insert(pos, newInst);
    if (!q.empty()) {
      q.emplace(true, dest, lhs.rank + rhs.rank);
    }
  }
}